

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptional.h
# Opt level: O0

aiReturn __thiscall ExceptionSwallower<aiReturn>::operator()(ExceptionSwallower<aiReturn> *this)

{
  iterator iVar1;
  bad_alloc *anon_var_0;
  ExceptionSwallower<aiReturn> *this_local;
  
  __cxa_rethrow();
  iVar1 = std::
          _Rb_tree<aiLogStream,_std::pair<const_aiLogStream,_Assimp::LogStream_*>,_std::_Select1st<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
          ::begin((_Rb_tree<aiLogStream,_std::pair<const_aiLogStream,_Assimp::LogStream_*>,_std::_Select1st<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
                   *)this);
  return (aiReturn)iVar1._M_node;
}

Assistant:

aiReturn operator ()() const {
        try {
            throw;
        }
        catch (std::bad_alloc&) {
            return aiReturn_OUTOFMEMORY;
        }
        catch (...) {
            return aiReturn_FAILURE;
        }
    }